

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O2

int If_ManCutAigDelay_rec(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = *(uint *)pObj;
  if ((uVar4 >> 9 & 1) == 0) {
    if ((uVar4 & 0xf) - 1 < 2) {
      iVar3 = -1;
    }
    else {
      if ((uVar4 & 0xf) != 4) {
        __assert_fail("If_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                      ,0x3a,"int If_ManCutAigDelay_rec(If_Man_t *, If_Obj_t *, Vec_Ptr_t *)");
      }
      *(uint *)pObj = uVar4 | 0x200;
      Vec_PtrPush(vVisited,pObj);
      uVar1 = If_ManCutAigDelay_rec(p,pObj->pFanin0,vVisited);
      uVar2 = If_ManCutAigDelay_rec(p,pObj->pFanin1,vVisited);
      uVar4 = uVar2;
      if (uVar2 < uVar1) {
        uVar4 = uVar1;
      }
      iVar3 = -1;
      if (-1 < (int)(uVar1 | uVar2)) {
        iVar3 = uVar4 + 1;
      }
      (pObj->field_22).iCopy = iVar3;
    }
  }
  else {
    iVar3 = (pObj->field_22).iCopy;
  }
  return iVar3;
}

Assistant:

int If_ManCutAigDelay_rec( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    int Delay0, Delay1;
    if ( pObj->fVisit )
        return pObj->iCopy;
    if ( If_ObjIsCi(pObj) || If_ObjIsConst1(pObj) )
        return -1;
    // store the node in the structure by level
    assert( If_ObjIsAnd(pObj) );
    pObj->fVisit = 1;
    Vec_PtrPush( vVisited, pObj );
    Delay0 = If_ManCutAigDelay_rec( p, pObj->pFanin0, vVisited );
    Delay1 = If_ManCutAigDelay_rec( p, pObj->pFanin1, vVisited );
    pObj->iCopy = (Delay0 >= 0 && Delay1 >= 0) ? 1 + Abc_MaxInt(Delay0, Delay1) : -1;
    return pObj->iCopy;
}